

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTable.cpp
# Opt level: O0

void QTable::Save(QTables *Qs,string *filename)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  undefined8 uVar4;
  const_reference pvVar5;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar6;
  size_type sVar7;
  size_type sVar8;
  string *in_RSI;
  vector<QTable,_std::allocator<QTable>_> *in_RDI;
  size_t a;
  size_t s;
  size_t k;
  size_t h;
  size_t nrColumns;
  size_t nrRows;
  stringstream ss;
  ofstream fp;
  stringstream *in_stack_fffffffffffffbe8;
  E *in_stack_fffffffffffffbf0;
  size_type i;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *this;
  size_type local_3d8;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_3d0;
  size_type local_3c8;
  stringstream local_3a8 [16];
  ostream local_398 [392];
  long local_210 [64];
  string *local_10;
  vector<QTable,_std::allocator<QTable>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_210,pcVar2,_S_out);
  bVar1 = std::ios::operator!((ios *)((long)local_210 + *(long *)(local_210[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::ios_base::precision((ios_base *)((long)local_210 + *(long *)(local_210[0] + -0x18)),0x10);
    pvVar5 = std::vector<QTable,_std::allocator<QTable>_>::operator[](local_8,0);
    pmVar6 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *)boost::numeric::ublas::
                matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                ::size1(&pvVar5->super_matrix_t);
    this = pmVar6;
    pvVar5 = std::vector<QTable,_std::allocator<QTable>_>::operator[](local_8,0);
    sVar7 = boost::numeric::ublas::
            matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::size2(&pvVar5->super_matrix_t);
    i = sVar7;
    sVar8 = std::vector<QTable,_std::allocator<QTable>_>::size(local_8);
    for (local_3c8 = 0; local_3c8 != sVar8; local_3c8 = local_3c8 + 1) {
      for (local_3d0 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                        *)0x0; local_3d0 != pmVar6;
          local_3d0 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                       *)((long)&local_3d0->size1_ + 1)) {
        for (local_3d8 = 0; local_3d8 != sVar7; local_3d8 = local_3d8 + 1) {
          std::vector<QTable,_std::allocator<QTable>_>::operator[](local_8,local_3c8);
          in_stack_fffffffffffffbf0 =
               (E *)boost::numeric::ublas::
                    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    ::operator()(this,i,(size_type)in_stack_fffffffffffffbf0);
          std::ostream::operator<<(local_210,(double)in_stack_fffffffffffffbf0->_vptr_E);
          if (local_3d8 != sVar7 - 1) {
            std::operator<<((ostream *)local_210," ");
          }
        }
        std::ostream::operator<<(local_210,std::endl<char,std::char_traits<char>>);
      }
    }
    std::ofstream::~ofstream(local_210);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_3a8);
  poVar3 = std::operator<<(local_398,"QTable::Save: failed to open file ");
  poVar3 = std::operator<<(poVar3,local_10);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  uVar4 = __cxa_allocate_exception(0x28);
  E::E(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  __cxa_throw(uVar4,&E::typeinfo,E::~E);
}

Assistant:

void QTable::Save(const QTables &Qs, const std::string &filename)
{
    ofstream fp(filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "QTable::Save: failed to open file " << filename << endl;
        throw E(ss);
    }

    fp.precision(16);

    size_t nrRows=Qs[0].size1(),
        nrColumns=Qs[0].size2(),
        h=Qs.size();

    for(size_t k=0;k!=h;++k)
        for(size_t s=0;s!=nrRows;++s)
        {
            for(size_t a=0;a!=nrColumns;++a)
            {
                fp << Qs[k](s,a);
                if(a!=nrColumns-1)
                    fp << " ";
            }
            fp << endl;
        }
}